

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rms.c
# Opt level: O3

int deleteFiles(char *directory)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  DIR *__dirp;
  dirent *pdVar4;
  stat st;
  char dirpath [4096];
  stat sStack_10c8;
  char local_1038 [4104];
  
  iVar2 = 1;
  if ((directory != (char *)0x0) && (*directory != '\0')) {
    _Var1 = isDirectory(directory);
    if (!_Var1) {
      iVar2 = deleteFile(directory);
      return iVar2;
    }
    memset(local_1038,0,0x1000);
    strcat(local_1038,directory);
    sVar3 = strlen(directory);
    if (directory[sVar3 - 1] != '/') {
      sVar3 = strlen(local_1038);
      (local_1038 + sVar3)[0] = '/';
      (local_1038 + sVar3)[1] = '\0';
    }
    __dirp = opendir(local_1038);
    pdVar4 = readdir(__dirp);
    if (pdVar4 != (dirent *)0x0) {
      do {
        pathJoin::buffer[0] = '\0';
        snprintf(pathJoin::buffer,0x1000,"%s/%s",local_1038,pdVar4->d_name);
        lstat(pathJoin::buffer,&sStack_10c8);
        if ((sStack_10c8.st_mode & 0xf000) == 0x4000) {
          _Var1 = isDotDirectory(pdVar4->d_name);
          if (!_Var1) {
            deleteFiles(pathJoin::buffer);
          }
        }
        else if ((sStack_10c8.st_mode & 0xf000) == 0x8000) {
          deleteFile(pathJoin::buffer);
        }
        pdVar4 = readdir(__dirp);
      } while (pdVar4 != (dirent *)0x0);
    }
    closedir(__dirp);
    rmdir(local_1038);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int deleteFiles(const char *directory) {
  if (!directory || !strlen(directory))
    return 1;

  if (!isDirectory(directory))
    return deleteFile(directory);

  char dirpath[PATH_MAX] = {0};
  strcat(dirpath, directory);
  if (directory[strlen(directory) - 1] != '/')
    strcat(dirpath, "/");

  DIR *dir = opendir(dirpath);
  struct dirent *ent;
  while ((ent = readdir(dir))) {
    struct stat st;
    const char *filepath = pathJoin(dirpath, ent->d_name);
    lstat(filepath, &st);

    if (S_ISREG(st.st_mode))
      deleteFile(filepath);
    else if (S_ISDIR(st.st_mode) && !isDotDirectory(ent->d_name))
      deleteFiles(filepath);
  }
  closedir(dir);
  rmdir(dirpath);
  return 0;
}